

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<int,int>(int input)

{
  bool bVar1;
  string *in_RDI;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  bVar1 = TypeIsNumber<int>();
  if ((bVar1) && (bVar1 = TypeIsNumber<int>(), bVar1)) {
    GetTypeId<int>();
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_b0);
    std::operator+((char *)in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::operator+(in_stack_fffffffffffffdf8,
                   (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    duckdb::ConvertToString::Operation<int>((int)local_e0);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffdf8,
                   (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    GetTypeId<int>();
    duckdb::TypeIdToString_abi_cxx11_(~INVALID);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  else {
    GetTypeId<int>();
    __lhs = &local_1a0;
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)__lhs);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    duckdb::ConvertToString::Operation<int>((int)local_1c0);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    GetTypeId<int>();
    duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&stack0xfffffffffffffe20);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}